

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

void __thiscall
iutest::detail::ParamTestSuiteInfo<iutest::TestWithAny>::OnRegisterTests
          (ParamTestSuiteInfo<iutest::TestWithAny> *this,IParamTestInfoData *infodata)

{
  pfnParamNameGeneratorFunc p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  size_t sVar6;
  pointer generator_name;
  scoped_ptr<iutest::detail::iuIParamGenerator<iutest::any>_> p;
  allocator<char> local_251;
  IParamTestInfoData *local_250;
  long *local_248;
  TestParamInfo<iutest::any> local_240;
  ParamTestSuiteInfo<iutest::TestWithAny> *local_230;
  pointer local_228;
  string testsuite_name;
  string name;
  string local_1e0;
  undefined1 local_1c0 [400];
  
  local_228 = (this->m_instantiation).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<iutest::TestWithAny>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<iutest::TestWithAny>::Functor>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_250 = infodata;
  local_230 = this;
  for (generator_name =
            (this->m_instantiation).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<iutest::TestWithAny>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<iutest::TestWithAny>::Functor>_>_>
            ._M_impl.super__Vector_impl_data._M_start; generator_name != local_228;
      generator_name = generator_name + 1) {
    p.m_ptr = (*(generator_name->second).CreateGen)();
    CreateTestSuiteName(&testsuite_name,local_230,&generator_name->first);
    iVar3 = (*local_250->_vptr_IParamTestInfoData[2])
                      (local_250,&testsuite_name,
                       &internal::helper::TestTypeIdHelper<iutest::TestWithAny>::_dummy,0,0);
    if (p.m_ptr != (iuIParamGenerator<int> *)0x0) {
      (*(p.m_ptr)->_vptr_iuIParamGenerator[2])();
      sVar6 = 0;
      while( true ) {
        iVar4 = (*(p.m_ptr)->_vptr_iuIParamGenerator[5])();
        if ((char)iVar4 != '\0') break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c0,(local_250->m_name)._M_dataplus._M_p,&local_251);
        p_Var1 = (generator_name->second).ParamNameGen;
        (*(p.m_ptr)->_vptr_iuIParamGenerator[3])(&local_248);
        if (local_248 == (long *)0x0) {
          local_240.param.content = (placeholder *)0x0;
        }
        else {
          local_240.param.content = (placeholder *)(**(code **)(*local_248 + 0x18))();
        }
        local_240.index = sVar6;
        (*p_Var1)(&local_1e0,&local_240);
        MakeParamTestName(&name,(string *)local_1c0,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        if (local_240.param.content != (placeholder *)0x0) {
          (*(local_240.param.content)->_vptr_placeholder[1])();
        }
        if (local_248 != (long *)0x0) {
          (**(code **)(*local_248 + 8))();
        }
        std::__cxx11::string::~string((string *)local_1c0);
        bVar2 = CheckTestName((TestSuite *)CONCAT44(extraout_var,iVar3),&name);
        if (!bVar2) {
          IUTestLog::IUTestLog
                    ((IUTestLog *)local_1c0,LOG_WARNING,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_params_util.hpp"
                     ,0xcb);
          poVar5 = std::operator<<((ostream *)(local_1c0 + 0x18),(string *)&testsuite_name);
          poVar5 = std::operator<<(poVar5,".");
          poVar5 = std::operator<<(poVar5,(string *)&name);
          std::operator<<(poVar5," is already exist.");
          IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
        }
        iVar4 = (*local_250->_vptr_IParamTestInfoData[3])
                          (local_250,(TestSuite *)CONCAT44(extraout_var,iVar3),&name);
        (*(p.m_ptr)->_vptr_iuIParamGenerator[3])(local_1c0);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                  ((long *)CONCAT44(extraout_var_00,iVar4),local_1c0);
        if ((long *)local_1c0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_1c0._0_8_ + 8))();
        }
        sVar6 = sVar6 + 1;
        std::__cxx11::string::~string((string *)&name);
        (*(p.m_ptr)->_vptr_iuIParamGenerator[4])();
      }
    }
    std::__cxx11::string::~string((string *)&testsuite_name);
    scoped_ptr<iutest::detail::iuIParamGenerator<iutest::any>_>::~scoped_ptr(&p);
  }
  return;
}

Assistant:

virtual void OnRegisterTests(IParamTestInfoData* infodata) const IUTEST_CXX_OVERRIDE
    {
        for( typename InstantiationContainer::const_iterator gen_it=m_instantiation.begin()
            , gen_end=m_instantiation.end(); gen_it != gen_end; ++gen_it )
        {
            // パラメータ生成器の作成
            detail::scoped_ptr<ParamGenerator> p((gen_it->second.CreateGen)());

            const ::std::string testsuite_name = CreateTestSuiteName(gen_it->first);
            const char* file = gen_it->second.m_file;
            const int line = gen_it->second.m_line;
            TestSuite* testsuite = infodata->MakeTestSuite(testsuite_name
                , internal::GetTypeId<Tester>()
                , IUTEST_GET_SETUP_TESTSUITE(Tester, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(Tester, file, line));

            if( p.get() != NULL )
            {
                size_t i=0;
                for( p->Begin(); !p->IsEnd(); p->Next() )
                {
                    const ::std::string name = MakeParamTestName(infodata->GetName()
                        , gen_it->second.ParamNameGen(TestParamInfo<ParamType>(p->GetCurrent(), i)) );
#if IUTEST_CHECK_STRICT
                    if( !CheckTestName(testsuite, name) )
                    {
                        IUTEST_LOG_(WARNING) << testsuite_name << "." << name << " is already exist.";
                    }
#endif
                    EachTest* test = static_cast<EachTest*>(infodata->RegisterTest(testsuite, name));
                    test->SetParam(p->GetCurrent());
                    ++i;
                }
            }
        }
    }